

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

TestPartResult * __thiscall testing::TestResult::GetTestPartResult(TestResult *this,int i)

{
  long lVar1;
  const_reference pvVar2;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  
  if (-1 < i) {
    lVar1 = (long)(this->test_part_results_).
                  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->test_part_results_).
                  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (i < (int)(lVar1 / 0x70)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
        pvVar2 = std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::at
                           (&this->test_part_results_,(ulong)(uint)i);
        return pvVar2;
      }
      __stack_chk_fail(this,CONCAT44(in_register_00000034,i),lVar1 % 0x70);
    }
  }
  abort();
}

Assistant:

const TestPartResult& TestResult::GetTestPartResult(int i) const {
  if (i < 0 || i >= total_part_count())
    internal::posix::Abort();
  return test_part_results_.at(i);
}